

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

dtree_t * read_final_tree(FILE *fp,pset_t *pset,uint32 n_pset)

{
  int iVar1;
  uint uVar2;
  dtree_t *pdVar3;
  lineiter_t *plVar4;
  dtree_node_t *pdVar5;
  dtree_node_t *pdVar6;
  ulong uVar7;
  comp_quest_t *q;
  ulong uVar8;
  dtree_node_t *pdVar9;
  ulong uVar10;
  char *pcVar11;
  uint32 n_scan;
  int local_f0;
  uint local_ec;
  float32 occ;
  uint32 node_id;
  uint32 local_e0;
  uint32 n_node;
  dtree_t *local_d8;
  lineiter_t *local_d0;
  float64 ent;
  pset_t *local_c0;
  char str [128];
  
  local_e0 = n_pset;
  local_c0 = pset;
  pdVar3 = (dtree_t *)
           __ckd_calloc__(1,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                          ,0x111);
  plVar4 = lineiter_start_clean(fp);
  pcVar11 = plVar4->buf;
  __isoc99_sscanf(pcVar11,"%s%n",str,&n_scan);
  iVar1 = bcmp(str,"n_node",7);
  if (iVar1 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
            ,0x11c,"Format error; expecting n_node\n");
    exit(1);
  }
  __isoc99_sscanf(pcVar11 + n_scan,"%u",&n_node);
  pdVar3->n_node = n_node;
  pdVar5 = (dtree_node_t *)
           __ckd_calloc__((ulong)n_node,0x68,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                          ,0x120);
  pdVar3->node = pdVar5;
  pdVar6 = pdVar5;
  for (uVar10 = 0; uVar10 < n_node; uVar10 = uVar10 + 1) {
    pdVar6->node_id = (uint32)uVar10;
    pdVar6 = pdVar6 + 1;
  }
  local_f0 = 0;
  local_d8 = pdVar3;
  while (plVar4 = lineiter_next(plVar4), plVar4 != (lineiter_t *)0x0) {
    pcVar11 = plVar4->buf;
    __isoc99_sscanf(pcVar11,"%u%n",&node_id,&n_scan);
    pcVar11 = pcVar11 + n_scan;
    __isoc99_sscanf(pcVar11,"%s%n",str,&n_scan);
    uVar10 = (ulong)n_scan;
    local_ec = 0xffffffff;
    if (str._0_2_ != 0x2d) {
      local_ec = atoi(str);
    }
    pcVar11 = pcVar11 + uVar10;
    local_d0 = plVar4;
    __isoc99_sscanf(pcVar11,"%s%n",str,&n_scan);
    uVar8 = (ulong)n_scan;
    uVar10 = 0xffffffff;
    if (str._0_2_ != 0x2d) {
      uVar2 = atoi(str);
      uVar10 = (ulong)uVar2;
    }
    pcVar11 = pcVar11 + uVar8;
    __isoc99_sscanf(pcVar11,"%le%n",&ent,&n_scan);
    uVar8 = (ulong)n_scan;
    __isoc99_sscanf(pcVar11 + uVar8,"%e%n",&occ,&n_scan);
    uVar2 = local_ec;
    if (local_ec == 0xffffffff) {
      uVar8 = (ulong)node_id;
      pdVar5[uVar8].q = (void *)0x0;
      pdVar5[uVar8].wt_ent = ent;
      pdVar5[uVar8].occ = occ;
      pdVar6 = (dtree_node_t *)0x0;
      pdVar9 = (dtree_node_t *)0x0;
    }
    else {
      uVar7 = (ulong)n_scan;
      q = (comp_quest_t *)
          __ckd_calloc__(1,0x18,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                         ,0x142);
      iVar1 = s3parse_comp_quest(local_c0,local_e0,q,pcVar11 + uVar8 + uVar7);
      if (iVar1 != 0) {
        local_f0 = 1;
      }
      uVar8 = (ulong)node_id;
      pdVar5[uVar8].q = q;
      pdVar5[uVar8].wt_ent_dec = ent;
      pdVar5[uVar8].occ = occ;
      pdVar6 = pdVar5 + uVar2;
      pdVar9 = pdVar5 + uVar10;
      pdVar5[uVar10].p = pdVar5 + uVar8;
      pdVar5[uVar2].p = pdVar5 + uVar8;
    }
    pdVar5[uVar8].y = pdVar6;
    pdVar5[uVar8].n = pdVar9;
    plVar4 = local_d0;
  }
  pdVar3 = local_d8;
  if (local_f0 == 1) {
    free_tree(local_d8);
    pdVar3 = (dtree_t *)0x0;
  }
  lineiter_free((lineiter_t *)0x0);
  return pdVar3;
}

Assistant:

dtree_t *
read_final_tree(FILE *fp,
		pset_t *pset,
		uint32 n_pset)
{
    dtree_t *out;
    dtree_node_t *node;
    uint32  n_node;
    char *s, str[128];
    lineiter_t *ln = NULL;
    uint32 n_scan;
    uint32 i, node_id, node_id_y, node_id_n;
    comp_quest_t *q;
    float64 ent;
    float32 occ;
    int err;

    out = ckd_calloc(1, sizeof(dtree_t));

    ln = lineiter_start_clean(fp);
    
    s = ln->buf;
    sscanf(s, "%s%n", str, &n_scan);
    if (strcmp(str, "n_node") == 0) {
	s += n_scan;
	sscanf(s, "%u", &n_node);
    }
    else {
	E_FATAL("Format error; expecting n_node\n");
    }

    out->n_node = n_node;
    out->node = node = ckd_calloc(n_node, sizeof(dtree_node_t));

    for (i = 0; i < n_node; i++)
	node[i].node_id = i;
    
    err = FALSE;
    
    while ((ln = lineiter_next(ln))) {
	s = ln->buf;

	sscanf(s, "%u%n", &node_id, &n_scan);
	s += n_scan;
	sscanf(s, "%s%n", str, &n_scan);
	s += n_scan;
	if (strcmp(str, "-") == 0) {
	    node_id_y = NO_ID;
	}
	else {
	    node_id_y = atoi(str);
	}
	sscanf(s, "%s%n", str, &n_scan);
	s += n_scan;
	if (strcmp(str, "-") == 0) {
	    node_id_n = NO_ID;
	}
	else {
	    node_id_n = atoi(str);
	}
	sscanf(s, "%le%n", &ent, &n_scan);
	s += n_scan;
	sscanf(s, "%e%n", &occ, &n_scan);
	s += n_scan;

	if ((node_id_y != NO_ID) && (node_id_y != NO_ID)) {
	    q = (comp_quest_t *)ckd_calloc(1, sizeof(comp_quest_t));
	    if (s3parse_comp_quest(pset, n_pset, q, s) != S3_SUCCESS) {
		err = TRUE;
	    }

	    node[node_id].q = q;
	}
	else
	    node[node_id].q = NULL;

	/* ck if internal node */
	if ((node_id_y != NO_ID) && (node_id_y != NO_ID))
	    node[node_id].wt_ent_dec = ent;
	else
	    node[node_id].wt_ent = ent;

	node[node_id].occ = occ;

	if ((node_id_y != NO_ID) && (node_id_y != NO_ID)) {
	    node[node_id].y = &node[node_id_y];
	    node[node_id].n = &node[node_id_n];
	    node[node_id_y].p = node[node_id_n].p = &node[node_id];
	}
	else {
	    node[node_id].y = NULL;
	    node[node_id].n = NULL;
	}
    }

    if (err == TRUE) {
	free_tree(out);
	out = NULL;
    }

    lineiter_free(ln);
    return out;
}